

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter_inc.h
# Opt level: O0

size_t FindBlocksCommand(uint16_t *data,size_t length,double block_switch_bitcost,
                        size_t num_histograms,HistogramCommand *histograms,double *insert_cost,
                        double *cost,uint8_t *switch_signal,uint8_t *block_id)

{
  double dVar1;
  ushort uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double local_f8;
  byte local_e1;
  uint8_t mask_1;
  long lStack_e0;
  uint8_t cur_id;
  size_t ix_1;
  size_t byte_ix_1;
  ulong uStack_c8;
  uint8_t mask;
  size_t k;
  double block_switch_cost;
  double min_cost;
  size_t insert_cost_ix;
  size_t ix;
  size_t byte_ix;
  size_t j;
  size_t i;
  size_t num_blocks;
  size_t bitmaplen;
  size_t data_size;
  double *cost_local;
  double *insert_cost_local;
  HistogramCommand *histograms_local;
  size_t num_histograms_local;
  double block_switch_bitcost_local;
  size_t length_local;
  uint16_t *data_local;
  double local_28;
  double local_10;
  
  uVar4 = num_histograms + 7 >> 3;
  i = 1;
  if (num_histograms < 2) {
    for (j = 0; j < length; j = j + 1) {
      block_id[j] = '\0';
    }
    data_local = (uint16_t *)0x1;
  }
  else {
    memset(insert_cost,0,num_histograms * 0x1600);
    for (j = 0; j < num_histograms; j = j + 1) {
      uVar5 = histograms[j].total_count_ & 0xffffffff;
      if (uVar5 < 0x100) {
        local_28 = (double)kLog2Table[uVar5];
      }
      else {
        auVar7._8_4_ = 0;
        auVar7._0_8_ = uVar5;
        auVar7._12_4_ = 0x45300000;
        local_28 = log2((auVar7._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)histograms[j].total_count_) -
                        4503599627370496.0));
      }
      insert_cost[j] = local_28;
    }
    j = 0x2c0;
    sVar3 = j;
    while (j = sVar3, j != 0) {
      for (byte_ix = 0; sVar3 = j - 1, byte_ix < num_histograms; byte_ix = byte_ix + 1) {
        dVar1 = insert_cost[byte_ix];
        uVar5 = CONCAT44(0,histograms[byte_ix].data_[j - 1]);
        if (uVar5 == 0) {
          local_f8 = -2.0;
        }
        else {
          if (uVar5 < 0x100) {
            local_10 = (double)kLog2Table[uVar5];
          }
          else {
            auVar8._8_4_ = 0;
            auVar8._0_8_ = uVar5;
            auVar8._12_4_ = 0x45300000;
            local_10 = log2((auVar8._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,histograms[byte_ix].data_[j - 1]) -
                            4503599627370496.0));
          }
          local_f8 = local_10;
        }
        insert_cost[(j - 1) * num_histograms + byte_ix] = dVar1 - local_f8;
      }
    }
    memset(cost,0,num_histograms << 3);
    memset(switch_signal,0,length * uVar4);
    for (j = 0; j < length; j = j + 1) {
      uVar2 = data[j];
      block_switch_cost = 1e+99;
      for (uStack_c8 = 0; uStack_c8 < num_histograms; uStack_c8 = uStack_c8 + 1) {
        cost[uStack_c8] = insert_cost[uVar2 * num_histograms + uStack_c8] + cost[uStack_c8];
        if (cost[uStack_c8] < block_switch_cost) {
          block_switch_cost = cost[uStack_c8];
          block_id[j] = (uint8_t)uStack_c8;
        }
      }
      k = (size_t)block_switch_bitcost;
      if (j < 2000) {
        auVar9._8_4_ = (int)(j >> 0x20);
        auVar9._0_8_ = j;
        auVar9._12_4_ = 0x45300000;
        k = (size_t)(((((auVar9._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)j) - 4503599627370496.0)) * 0.07) / 2000.0
                     + 0.77) * block_switch_bitcost);
      }
      for (uStack_c8 = 0; uStack_c8 < num_histograms; uStack_c8 = uStack_c8 + 1) {
        cost[uStack_c8] = cost[uStack_c8] - block_switch_cost;
        if ((double)k <= cost[uStack_c8]) {
          cost[uStack_c8] = (double)k;
          lVar6 = j * uVar4 + (uStack_c8 >> 3);
          switch_signal[lVar6] = switch_signal[lVar6] | (byte)(1 << ((byte)uStack_c8 & 7));
        }
      }
    }
    ix_1 = length - 1;
    lStack_e0 = ix_1 * uVar4;
    local_e1 = block_id[ix_1];
    while (ix_1 != 0) {
      ix_1 = ix_1 - 1;
      lStack_e0 = lStack_e0 - uVar4;
      if (((switch_signal[lStack_e0 + ((int)(uint)local_e1 >> 3)] & (byte)(1 << (local_e1 & 7))) !=
           0) && (local_e1 != block_id[ix_1])) {
        local_e1 = block_id[ix_1];
        i = i + 1;
      }
      block_id[ix_1] = local_e1;
    }
    data_local = (uint16_t *)i;
  }
  return (size_t)data_local;
}

Assistant:

static size_t FN(FindBlocks)(const DataType* data, const size_t length,
                             const double block_switch_bitcost,
                             const size_t num_histograms,
                             const HistogramType* histograms,
                             double* insert_cost,
                             double* cost,
                             uint8_t* switch_signal,
                             uint8_t* block_id) {
  const size_t data_size = FN(HistogramDataSize)();
  const size_t bitmaplen = (num_histograms + 7) >> 3;
  size_t num_blocks = 1;
  size_t i;
  size_t j;
  BROTLI_DCHECK(num_histograms <= 256);
  if (num_histograms <= 1) {
    for (i = 0; i < length; ++i) {
      block_id[i] = 0;
    }
    return 1;
  }
  memset(insert_cost, 0, sizeof(insert_cost[0]) * data_size * num_histograms);
  for (i = 0; i < num_histograms; ++i) {
    insert_cost[i] = FastLog2((uint32_t)histograms[i].total_count_);
  }
  for (i = data_size; i != 0;) {
    --i;
    for (j = 0; j < num_histograms; ++j) {
      insert_cost[i * num_histograms + j] =
          insert_cost[j] - BitCost(histograms[j].data_[i]);
    }
  }
  memset(cost, 0, sizeof(cost[0]) * num_histograms);
  memset(switch_signal, 0, sizeof(switch_signal[0]) * length * bitmaplen);
  /* After each iteration of this loop, cost[k] will contain the difference
     between the minimum cost of arriving at the current byte position using
     entropy code k, and the minimum cost of arriving at the current byte
     position. This difference is capped at the block switch cost, and if it
     reaches block switch cost, it means that when we trace back from the last
     position, we need to switch here. */
  for (i = 0; i < length; ++i) {
    const size_t byte_ix = i;
    size_t ix = byte_ix * bitmaplen;
    size_t insert_cost_ix = data[byte_ix] * num_histograms;
    double min_cost = 1e99;
    double block_switch_cost = block_switch_bitcost;
    size_t k;
    for (k = 0; k < num_histograms; ++k) {
      /* We are coding the symbol in data[byte_ix] with entropy code k. */
      cost[k] += insert_cost[insert_cost_ix + k];
      if (cost[k] < min_cost) {
        min_cost = cost[k];
        block_id[byte_ix] = (uint8_t)k;
      }
    }
    /* More blocks for the beginning. */
    if (byte_ix < 2000) {
      block_switch_cost *= 0.77 + 0.07 * (double)byte_ix / 2000;
    }
    for (k = 0; k < num_histograms; ++k) {
      cost[k] -= min_cost;
      if (cost[k] >= block_switch_cost) {
        const uint8_t mask = (uint8_t)(1u << (k & 7));
        cost[k] = block_switch_cost;
        BROTLI_DCHECK((k >> 3) < bitmaplen);
        switch_signal[ix + (k >> 3)] |= mask;
      }
    }
  }
  {  /* Trace back from the last position and switch at the marked places. */
    size_t byte_ix = length - 1;
    size_t ix = byte_ix * bitmaplen;
    uint8_t cur_id = block_id[byte_ix];
    while (byte_ix > 0) {
      const uint8_t mask = (uint8_t)(1u << (cur_id & 7));
      BROTLI_DCHECK(((size_t)cur_id >> 3) < bitmaplen);
      --byte_ix;
      ix -= bitmaplen;
      if (switch_signal[ix + (cur_id >> 3)] & mask) {
        if (cur_id != block_id[byte_ix]) {
          cur_id = block_id[byte_ix];
          ++num_blocks;
        }
      }
      block_id[byte_ix] = cur_id;
    }
  }
  return num_blocks;
}